

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O1

void __thiscall fizplex::Simplex::set_basic_solution(Simplex *this,Base *base)

{
  double dVar1;
  LP *pLVar2;
  size_t *psVar3;
  bool bVar4;
  double *pdVar5;
  SVector *vec;
  size_t *psVar6;
  size_t sVar7;
  DVector beta;
  DVector local_68;
  Base *local_50;
  SVector local_48;
  
  pLVar2 = this->lp;
  local_68.vals._M_size = (pLVar2->b).vals._M_size;
  local_50 = base;
  local_68.vals._M_data = (double *)operator_new(local_68.vals._M_size << 3);
  pdVar5 = (pLVar2->b).vals._M_data;
  if (pdVar5 != (double *)0x0) {
    memcpy(local_68.vals._M_data,pdVar5,local_68.vals._M_size << 3);
  }
  local_68.dim = (pLVar2->b).dim;
  psVar6 = (this->non_basic_indices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar3 = (this->non_basic_indices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar6 != psVar3) {
    do {
      sVar7 = *psVar6;
      pdVar5 = DVector::operator[](&this->x,sVar7);
      dVar1 = *pdVar5;
      vec = ColMatrix::column(&this->lp->A,sVar7);
      operator*(&local_48,dVar1,vec);
      DVector::operator-=(&local_68,&local_48);
      if (local_48.values.
          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.values.
                        super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.values.
                              super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.values.
                              super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar3);
  }
  Base::ftran(local_50,&local_68);
  if ((this->basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->basic_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    sVar7 = 0;
    do {
      pdVar5 = DVector::operator[](&local_68,sVar7);
      dVar1 = *pdVar5;
      pdVar5 = DVector::operator[](&this->x,(this->basic_indices).
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start[sVar7]);
      *pdVar5 = dVar1;
      sVar7 = sVar7 + 1;
    } while (sVar7 < (ulong)((long)(this->basic_indices).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->basic_indices).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (this->phase == Two) {
    bVar4 = LP::is_feasible(this->lp,&this->x);
    if (!bVar4) {
      __assert_fail("lp.is_feasible(x)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex.cc"
                    ,0x78,"void fizplex::Simplex::set_basic_solution(Base &)");
    }
  }
  operator_delete(local_68.vals._M_data);
  return;
}

Assistant:

void Simplex::set_basic_solution(Base &base) {
  DVector beta = lp.b;
  for (auto i : non_basic_indices)
    beta -= x[i] * lp.A.column(i);
  base.ftran(beta);

  for (size_t i = 0; i < basic_indices.size(); i++)
    x[basic_indices[i]] = beta[i];

  if (phase == Phase::Two)
    assert(lp.is_feasible(x));
}